

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailManager.cpp
# Opt level: O0

void __thiscall mailManager::~mailManager(mailManager *this)

{
  mailManager *this_local;
  
  mailSocket::sendData(this->socket,"quit\r\n");
  mailSocket::recvData(this->socket,this->recvData,0x400);
  std::__cxx11::list<FILEINFO_*,_std::allocator<FILEINFO_*>_>::~list(&this->list);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->map);
  return;
}

Assistant:

mailManager::~mailManager() {
    socket->sendData("quit\r\n");
    socket->recvData(recvData, BUF_SIZE);
}